

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

int luaL_callmeta(lua_State *L,int idx,char *field)

{
  TValue *pTVar1;
  int iVar2;
  TValue *pTVar3;
  
  iVar2 = luaL_getmetafield(L,idx,field);
  if (iVar2 != 0) {
    pTVar1 = L->top;
    L->top = pTVar1 + -1;
    pTVar3 = index2adr(L,idx);
    *pTVar1 = *pTVar3;
    L->top = pTVar1 + 1;
    lj_vm_call(L,pTVar1,2);
  }
  return (uint)(iVar2 != 0);
}

Assistant:

LUALIB_API int luaL_callmeta(lua_State *L, int idx, const char *field)
{
  if (luaL_getmetafield(L, idx, field)) {
    TValue *base = L->top--;
    copyTV(L, base, index2adr(L, idx));
    L->top = base+1;
    lj_vm_call(L, base, 1+1);
    return 1;
  }
  return 0;
}